

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

char * nlohmann::detail::dtoa_impl::append_exponent(char *buf,int e)

{
  ushort uVar1;
  byte bVar3;
  ulong uVar2;
  byte *pbVar4;
  long lStack_8;
  
  uVar2 = (ulong)(uint)-e;
  if (0 < e) {
    uVar2 = (ulong)(uint)e;
  }
  *buf = (char)(e >> 0x1f) * -2 + '+';
  if ((uint)uVar2 < 10) {
    buf[1] = '0';
  }
  else {
    if (99 < (uint)uVar2) {
      buf[1] = (char)(uVar2 / 100) + '0';
      uVar1 = (ushort)(uVar2 % 100);
      bVar3 = (byte)(uVar1 % 10);
      pbVar4 = (byte *)(buf + 3);
      buf[2] = (byte)(uVar1 / 10) | 0x30;
      lStack_8 = 4;
      goto LAB_00466d0c;
    }
    uVar1 = (ushort)uVar2 & 0xff;
    uVar2 = (ulong)(byte)(uVar1 % 10);
    buf[1] = (byte)(uVar1 / 10) | 0x30;
  }
  pbVar4 = (byte *)(buf + 2);
  bVar3 = (byte)uVar2;
  lStack_8 = 3;
LAB_00466d0c:
  *pbVar4 = bVar3 | 0x30;
  return buf + lStack_8;
}

Assistant:

inline char* append_exponent(char* buf, int e)
{
    JSON_ASSERT(e > -1000);
    JSON_ASSERT(e <  1000);

    if (e < 0)
    {
        e = -e;
        *buf++ = '-';
    }
    else
    {
        *buf++ = '+';
    }

    auto k = static_cast<std::uint32_t>(e);
    if (k < 10)
    {
        // Always print at least two digits in the exponent.
        // This is for compatibility with printf("%g").
        *buf++ = '0';
        *buf++ = static_cast<char>('0' + k);
    }
    else if (k < 100)
    {
        *buf++ = static_cast<char>('0' + k / 10);
        k %= 10;
        *buf++ = static_cast<char>('0' + k);
    }
    else
    {
        *buf++ = static_cast<char>('0' + k / 100);
        k %= 100;
        *buf++ = static_cast<char>('0' + k / 10);
        k %= 10;
        *buf++ = static_cast<char>('0' + k);
    }

    return buf;
}